

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

ostream * nonius::detail::operator<<(ostream *os,help_text *h)

{
  pointer poVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  pointer poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> l;
  option o;
  
  poVar4 = std::operator<<(os,"Usage: ");
  poVar4 = std::operator<<(poVar4,(string *)h);
  std::operator<<(poVar4," [OPTIONS]\n\n");
  iVar2 = operator<<((h->options->
                     super__Vector_base<nonius::detail::option,_std::allocator<nonius::detail::option>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (h->options->
                     super__Vector_base<nonius::detail::option,_std::allocator<nonius::detail::option>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  iVar3 = operator<<((h->options->
                     super__Vector_base<nonius::detail::option,_std::allocator<nonius::detail::option>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (h->options->
                     super__Vector_base<nonius::detail::option,_std::allocator<nonius::detail::option>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffff4f | 0x20;
  poVar1 = (h->options->
           super__Vector_base<nonius::detail::option,_std::allocator<nonius::detail::option>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (poVar5 = (h->options->
                super__Vector_base<nonius::detail::option,_std::allocator<nonius::detail::option>_>)
                ._M_impl.super__Vector_impl_data._M_start; poVar5 != poVar1; poVar5 = poVar5 + 1) {
    option::option(&o,poVar5);
    std::operator+(&l,"--",&o.long_form);
    std::operator+(&s,"-",&o.short_form);
    if (o.argument._M_string_length != 0) {
      std::operator+(&local_118,"=",&o.argument);
      std::__cxx11::string::append((string *)&l);
      std::__cxx11::string::~string((string *)&local_118);
      std::operator+(&local_118," ",&o.argument);
      std::__cxx11::string::append((string *)&s);
      std::__cxx11::string::~string((string *)&local_118);
    }
    *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = (long)(iVar2 + 2);
    poVar4 = std::operator<<(os,(string *)&l);
    *(long *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = (long)(iVar3 + 2);
    poVar4 = std::operator<<(poVar4,(string *)&s);
    poVar4 = std::operator<<(poVar4,(string *)&o.description);
    std::operator<<(poVar4,'\n');
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::string::~string((string *)&l);
    option::~option(&o);
  }
  return os;
}

Assistant:

inline std::ostream& operator<<(std::ostream& os, help_text h) {
            os << "Usage: " << h.name << " [OPTIONS]\n\n";

            auto lwidth = 2 + get_max_width(h.options.begin(), h.options.end(), [](option const& o) { return 2 + o.long_form.size() + 1 + o.argument.size(); });
            auto swidth = 2 + get_max_width(h.options.begin(), h.options.end(), [](option const& o) { return 1 + o.short_form.size() + 1 + o.argument.size(); });

            os << std::left;
            for(auto o : h.options) {
                auto l = "--" + o.long_form;
                auto s = "-" + o.short_form;
                if(!o.argument.empty()) {
                    l += "=" + o.argument;
                    s += " " + o.argument;
                }
                os << std::setw(lwidth) << l
                   << std::setw(swidth) << s
                   << o.description
                   << '\n';
            }
            return os;
        }